

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modules.cpp
# Opt level: O1

void module_with_dependent_async_launch(uint W)

{
  char *pcVar1;
  long *plVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  code *pcVar7;
  double dVar8;
  long lVar9;
  void *pvVar10;
  FlowBuilder FVar11;
  FlowBuilder FVar12;
  char extraout_AL;
  bool bVar13;
  long lVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar16;
  Task D;
  Task C;
  Task E;
  Task B;
  int local_3e0;
  int cnt;
  ResultBuilder DOCTEST_RB;
  Task A;
  pair<tf::AsyncTask,_std::future<void>_> local_358;
  Result local_340;
  Taskflow f1;
  shared_ptr<tf::WorkerInterface> local_258;
  pointer local_248;
  undefined4 local_240;
  Task m1_1;
  Taskflow f0;
  Executor executor;
  
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_258);
  if (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  f0.super_FlowBuilder._graph = &f0._graph;
  f0._mutex.super___mutex_base._M_mutex.__align = 0;
  f0._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  f0._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  f0._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  f0._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  f0._name._M_dataplus._M_p = (pointer)&f0._name.field_2;
  f0._name._M_string_length = 0;
  f0._name.field_2._M_local_buf[0] = '\0';
  f0._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f0._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f0._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&f0._topologies,0);
  FVar11._graph = f0.super_FlowBuilder._graph;
  f0._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  cnt = 0;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:598:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:598:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar11._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  FVar12._graph = f0.super_FlowBuilder._graph;
  A._node = ((FVar11._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:599:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:599:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar12._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  FVar11._graph = f0.super_FlowBuilder._graph;
  B._node = ((FVar12._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:600:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:600:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar11._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  FVar12._graph = f0.super_FlowBuilder._graph;
  C._node = ((FVar11._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:601:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:601:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar12._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  FVar11._graph = f0.super_FlowBuilder._graph;
  D._node = ((FVar12._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:602:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:602:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar11._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  E._node = ((FVar11._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  tf::Task::precede<tf::Task&>(&A,&B);
  tf::Task::precede<tf::Task&>(&B,&C);
  tf::Task::precede<tf::Task&>(&C,&D);
  tf::Task::precede<tf::Task&>(&D,&E);
  f1.super_FlowBuilder._graph = &f1._graph;
  f1._mutex.super___mutex_base._M_mutex.__align = 0;
  f1._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  f1._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  f1._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  f1._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  f1._name._M_dataplus._M_p = (pointer)&f1._name.field_2;
  f1._name._M_string_length = 0;
  f1._name.field_2._M_local_buf[0] = '\0';
  f1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&f1._topologies,0);
  FVar11._graph = f1.super_FlowBuilder._graph;
  f1._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
  *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
  *(pointer *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = (pointer)&cnt;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:613:5)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:613:5)>
               ::_M_manager;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar11._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&DOCTEST_RB,
               (Node *)DOCTEST_RB.super_AssertData.m_test_case);
  }
  FVar12._graph = f1.super_FlowBuilder._graph;
  pNVar3 = ((FVar11._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
  *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
  *(pointer *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = (pointer)&cnt;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:614:5)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:614:5)>
               ::_M_manager;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar12._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&DOCTEST_RB,
               (Node *)DOCTEST_RB.super_AssertData.m_test_case);
  }
  FVar11._graph = f1.super_FlowBuilder._graph;
  pNVar4 = ((FVar12._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
  *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
  *(pointer *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = (pointer)&cnt;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:615:5)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:615:5)>
               ::_M_manager;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar11._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&DOCTEST_RB,
               (Node *)DOCTEST_RB.super_AssertData.m_test_case);
  }
  FVar12._graph = f1.super_FlowBuilder._graph;
  pNVar5 = ((FVar11._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
  *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
  *(pointer *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = (pointer)&cnt;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:616:5)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:616:5)>
               ::_M_manager;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar12._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&DOCTEST_RB,
               (Node *)DOCTEST_RB.super_AssertData.m_test_case);
  }
  FVar11._graph = f1.super_FlowBuilder._graph;
  pNVar6 = ((FVar12._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
  *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
  *(pointer *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = (pointer)&cnt;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:617:5)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:617:5)>
               ::_M_manager;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar11._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&DOCTEST_RB,
               (Node *)DOCTEST_RB.super_AssertData.m_test_case);
  }
  E._node = ((FVar11._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  D._node = pNVar6;
  C._node = pNVar5;
  B._node = pNVar4;
  A._node = pNVar3;
  tf::Task::precede<tf::Task&>(&A,&B);
  tf::Task::precede<tf::Task&>(&B,&C);
  tf::Task::precede<tf::Task&>(&C,&D);
  tf::Task::precede<tf::Task&>(&D,&E);
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)0x0;
  local_340.m_passed = false;
  local_340._1_7_ = 0;
  local_358.first._node._0_4_ = 0;
  m1_1._node = tf::Graph::
               _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Module>,tf::Taskflow&>
                         (f1.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                          (DefaultTaskParams *)&local_248,(void **)&DOCTEST_RB,(void **)&local_340,
                          (int *)&local_358,(in_place_type_t<tf::Node::Module> *)&local_3e0,&f0);
  tf::Task::precede<tf::Task&>(&E,&m1_1);
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&f1;
  tf::Executor::
  dependent_async<tf::DefaultTaskParams,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_module_hpp:14:10),_tf::AsyncTask_*,_nullptr>
            (&local_358,&executor,(DefaultTaskParams *)&local_340,
             (anon_class_8_1_6ca262cf *)&DOCTEST_RB,(AsyncTask *)0x0,(AsyncTask *)0x0);
  std::future<void>::get(&local_358.second);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x276;
  DOCTEST_RB.super_AssertData.m_expr = "cnt == 10";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_240 = 0xc;
  local_3e0 = 10;
  local_248 = (pointer)&cnt;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_340,(Expression_lhs<int_const&> *)&local_248,&local_3e0);
  doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_340.m_decomp);
  DOCTEST_RB.super_AssertData._40_2_ =
       CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_340.m_passed) ^ 1;
  uVar15 = extraout_XMM0_Da;
  uVar16 = extraout_XMM0_Db;
  if ((local_340.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_340.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_340.m_decomp.field_0.data.ptr);
    uVar15 = extraout_XMM0_Da_00;
    uVar16 = extraout_XMM0_Db_00;
  }
  dVar8 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar16,uVar15));
  if (extraout_AL != '\0') {
    pcVar7 = (code *)swi(3);
    (*pcVar7)(SUB84(dVar8,0));
    return;
  }
  if (DOCTEST_RB.super_AssertData.m_failed == true) {
    bVar13 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
    if (bVar13) {
      doctest::detail::throwException();
    }
  }
  if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                       DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                       DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                       DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                       DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_358.second.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_358.second.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  lVar9 = CONCAT44(local_358.first._node._4_4_,local_358.first._node._0_4_);
  if (lVar9 != 0) {
    lVar14 = 0;
    if (*(char *)(lVar9 + 0xc0) == '\b') {
      lVar14 = lVar9 + 0x88;
    }
    LOCK();
    plVar2 = (long *)(lVar14 + 0x28);
    *plVar2 = *plVar2 + -1;
    UNLOCK();
    if ((*plVar2 == 0) &&
       (pvVar10 = (void *)CONCAT44(local_358.first._node._4_4_,local_358.first._node._0_4_),
       pvVar10 != (void *)0x0)) {
      if (*(long *)((long)pvVar10 + 0xd0) != 0) {
        std::__exception_ptr::exception_ptr::_M_release();
      }
      if (*(Semaphores **)((long)pvVar10 + 200) != (Semaphores *)0x0) {
        std::default_delete<tf::Node::Semaphores>::operator()
                  ((default_delete<tf::Node::Semaphores> *)((long)pvVar10 + 200),
                   *(Semaphores **)((long)pvVar10 + 200));
      }
      *(undefined8 *)((long)pvVar10 + 200) = 0;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           *)((long)pvVar10 + 0x88));
      if (*(void **)((long)pvVar10 + 0x48) != (void *)((long)pvVar10 + 0x60)) {
        free(*(void **)((long)pvVar10 + 0x48));
      }
      if (*(long **)((long)pvVar10 + 8) != (long *)((long)pvVar10 + 0x18)) {
        operator_delete(*(long **)((long)pvVar10 + 8),*(long *)((long)pvVar10 + 0x18) + 1);
      }
      operator_delete(pvVar10,0xd8);
    }
  }
  tf::Taskflow::~Taskflow(&f1);
  tf::Taskflow::~Taskflow(&f0);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void module_with_dependent_async_launch(unsigned W) {

  tf::Executor executor(W);

  tf::Taskflow f0;

  int cnt {0};

  auto A = f0.emplace([&cnt](){ ++cnt; });
  auto B = f0.emplace([&cnt](){ ++cnt; });
  auto C = f0.emplace([&cnt](){ ++cnt; });
  auto D = f0.emplace([&cnt](){ ++cnt; });
  auto E = f0.emplace([&cnt](){ ++cnt; });

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);

  tf::Taskflow f1;

  // module 1
  std::tie(A, B, C, D, E) = f1.emplace(
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; }
  );
  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);
  auto m1_1 = f1.composed_of(f0);
  E.precede(m1_1);

  auto [task, future] = executor.dependent_async(tf::make_module_task(f1)); 

  future.get();

  REQUIRE(cnt == 10);
}